

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)6,(moira::Mode)4,(moira::Size)4>(Moira *this,u16 opcode)

{
  int *piVar1;
  u16 uVar2;
  u16 uVar3;
  byte bVar4;
  u32 addr;
  u32 uVar5;
  undefined8 in_RAX;
  bool bVar6;
  ulong uVar7;
  bool error;
  bool local_31;
  
  local_31 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar2 = (this->queue).irc;
  readExt(this);
  uVar3 = (this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)4,(moira::Size)4,0ul>(this,opcode & 7);
  uVar5 = readM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,addr,&local_31);
  piVar1 = (int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -4;
  if (local_31 == false) {
    uVar7 = (ulong)uVar5 + (ulong)CONCAT22(uVar2,uVar3);
    bVar6 = SUB81(uVar7 >> 0x20,0);
    (this->reg).sr.c = bVar6;
    (this->reg).sr.x = bVar6;
    bVar4 = (byte)(uVar7 >> 0x18);
    (this->reg).sr.v =
         (bool)((byte)(((byte)(uVar5 >> 0x18) ^ bVar4) & ((byte)(uVar2 >> 8) ^ bVar4)) >> 7);
    (this->reg).sr.z = (uint)uVar7 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar7 >> 0x1f) & 1);
    uVar5 = (this->reg).pc;
    (this->reg).pc0 = uVar5;
    (this->queue).ird = (this->queue).irc;
    uVar5 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar5 + 2);
    (this->queue).irc = (u16)uVar5;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,(uint)(uVar7 >> 0x10) & 0xffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr + 2,(uint)uVar7 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}